

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O3

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_unary_expression
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_unary_expression_t *expr)

{
  vector<long,_std::allocator<long>_> *this_00;
  iterator __position;
  instruction_t iVar1;
  typed_expression_t *ptVar2;
  ulong local_18;
  
  ptVar2 = typed_unary_expression_t::operand(expr);
  (**(code **)(*(long *)ptVar2 + 0x30))(ptVar2,this);
  iVar1 = operator_to_instruction(this,(expr->super_unary_expression_t)._operator);
  local_18 = (ulong)iVar1;
  this_00 = (this->_bytecode_back_inserter).container;
  __position._M_current =
       (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (this_00,__position,(long *)&local_18);
  }
  else {
    *__position._M_current = local_18;
    (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void compile_unary_expression(tchecker::typed_unary_expression_t const & expr)
  {
    expr.operand().visit(*this);
    _bytecode_back_inserter = operator_to_instruction(expr.unary_operator());
  }